

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PigLatinTranslator::separate_punctuation
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PigLatinTranslator *this,string *text)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,3,(allocator_type *)local_50);
  if (text->_M_string_length != 0) {
    if (text->_M_string_length == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        lVar1 = std::__cxx11::string::find
                          ((char)this + '(',(ulong)(uint)(int)(text->_M_dataplus)._M_p[uVar5]);
        if (lVar1 == -1) break;
        uVar5 = uVar5 + 1;
      } while (uVar5 < text->_M_string_length);
    }
    if ((int)uVar5 != 0) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)text);
      std::__cxx11::string::operator=
                ((string *)
                 (__return_storage_ptr__->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    uVar2 = text->_M_string_length;
    if (uVar2 != uVar5) {
      uVar3 = uVar2 & 0xffffffff;
      iVar4 = (int)uVar2 + 1;
      uVar5 = (long)((int)uVar2 + -1);
      do {
        uVar2 = uVar5;
        uVar3 = uVar3 - 1;
        if (iVar4 + -2 < 1) break;
        lVar1 = std::__cxx11::string::find
                          ((char)this + '(',
                           (ulong)(uint)(int)(text->_M_dataplus)._M_p[(uint)uVar3 & 0x7fffffff]);
        iVar4 = iVar4 + -1;
        uVar5 = uVar2 - 1;
      } while (lVar1 != -1);
      if (uVar2 < text->_M_string_length) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)text);
        std::__cxx11::string::operator=
                  ((string *)
                   ((__return_storage_ptr__->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 2),(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)text);
      std::__cxx11::string::operator=
                ((string *)
                 ((__return_storage_ptr__->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 1),(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> PigLatinTranslator::separate_punctuation(const std::string& text) const {
    std::vector<std::string> punct_sep_str(3);

    if( text.empty() ) {
        return punct_sep_str;
    }

    // Find beginning of the word
    int word_start = 0;
    while (word_start < text.size() && is_punctuation(text[word_start])) {
        word_start++;
    }

    // Store start punctuation
    if (word_start > 0) {
        punct_sep_str[0] = text.substr(0, word_start);
    }
    if (word_start == text.size()) {
        // Only punctuation
        return punct_sep_str;
    }

    // Find end of word
    int word_end = text.size() - 1;
    while (word_end > 0 && is_punctuation(text[word_end])) {
        word_end--;
    }

    // Store end punctuation
    if (word_end < text.size()) {
        punct_sep_str[2] = text.substr(word_end+1);
    }

    // Store word and return
    punct_sep_str[1] = text.substr(word_start, word_end - word_start + 1);
    return punct_sep_str;
}